

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> * __thiscall
ear::Layout::nominalPositions
          (vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> *__return_storage_ptr__,
          Layout *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  back_insert_iterator<std::vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>_> bVar3;
  Layout *this_local;
  vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> *pos;
  
  std::vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>::vector
            (__return_storage_ptr__);
  cVar1 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(&this->_channels);
  cVar2 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(&this->_channels);
  bVar3 = std::back_inserter<std::vector<ear::PolarPosition,std::allocator<ear::PolarPosition>>>
                    (__return_storage_ptr__);
  std::
  transform<__gnu_cxx::__normal_iterator<ear::Channel_const*,std::vector<ear::Channel,std::allocator<ear::Channel>>>,std::back_insert_iterator<std::vector<ear::PolarPosition,std::allocator<ear::PolarPosition>>>,ear::Layout::nominalPositions()const::__0>
            (cVar1._M_current,cVar2._M_current,bVar3.container);
  return __return_storage_ptr__;
}

Assistant:

std::vector<PolarPosition> Layout::nominalPositions() const {
    std::vector<PolarPosition> pos;
    std::transform(
        _channels.begin(), _channels.end(), std::back_inserter(pos),
        [](Channel c) -> PolarPosition { return c.polarPositionNominal(); });
    return pos;
  }